

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,UInt24 u)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((this->style->numberFormat).radix == '\x10') {
    sprintx(&this->ptr,(ulong)u.raw,&this->style->numberFormat,6);
  }
  else {
    uVar2 = 9;
    uVar1 = (ulong)u.raw;
    do {
      this->ptr[uVar2 - 2] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
      uVar2 = uVar2 - 1;
      uVar1 = uVar1 / 10;
    } while (1 < uVar2);
    this->ptr = this->ptr + 8;
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(UInt24 u)
{
    if (style.numberFormat.radix == 16) {
        sprintx(ptr, u.raw, style.numberFormat, 6);
    } else {
        sprintd(ptr, u.raw, 8);
    }
    return *this;
}